

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_scaling_list(bitstream *str,uint32_t *scaling_list,int size,uint32_t *use_default_flag)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint *in_RCX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  bool bVar4;
  int haltidx;
  int i;
  int32_t delta_scale;
  uint32_t nextScale;
  uint32_t lastScale;
  uint local_44;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar5;
  int in_stack_ffffffffffffffcc;
  uint local_30;
  uint local_2c;
  
  local_2c = 8;
  local_30 = 8;
  if (*in_RDI == 1) {
    for (iVar5 = 0; iVar5 < in_EDX; iVar5 = iVar5 + 1) {
      uVar2 = in_stack_ffffffffffffffc0;
      if (local_30 != 0) {
        iVar1 = vs_se((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,iVar5),
                      (int32_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        if (iVar1 != 0) {
          return 1;
        }
        local_30 = local_2c + in_stack_ffffffffffffffcc + 0x100 & 0xff;
        uVar2 = in_stack_ffffffffffffffc0 & 0xffffff;
        if (iVar5 == 0) {
          uVar2 = CONCAT13(local_30 == 0,(int3)in_stack_ffffffffffffffc0);
        }
        *in_RCX = uVar2 >> 0x18;
      }
      if (local_30 == 0) {
        local_44 = local_2c;
      }
      else {
        local_44 = local_30;
      }
      local_2c = local_44;
      *(uint *)(in_RSI + (long)iVar5 * 4) = local_44;
      in_stack_ffffffffffffffc0 = uVar2;
    }
  }
  else {
    iVar5 = in_EDX;
    if (*in_RCX != 0) {
      iVar5 = 0;
    }
    while( true ) {
      bVar4 = false;
      if (1 < iVar5) {
        bVar4 = *(int *)(in_RSI + (long)(iVar5 + -1) * 4) ==
                *(int *)(in_RSI + (long)(iVar5 + -2) * 4);
      }
      if (!bVar4) break;
      iVar5 = iVar5 + -1;
    }
    for (iVar1 = 0; iVar1 < iVar5; iVar1 = iVar1 + 1) {
      uVar2 = (*(int *)(in_RSI + (long)iVar1 * 4) - local_2c) + 0x100 & 0xff;
      if (0x7f < uVar2) {
        uVar2 = uVar2 - 0x100;
      }
      iVar3 = vs_se((bitstream *)CONCAT44(uVar2,iVar1),
                    (int32_t *)CONCAT44(iVar5,in_stack_ffffffffffffffc0));
      if (iVar3 != 0) {
        return 1;
      }
      local_2c = *(uint *)(in_RSI + (long)iVar1 * 4);
    }
    if (iVar1 != in_EDX) {
      uVar2 = 0x100 - local_2c & 0xff;
      if (0x7f < uVar2) {
        uVar2 = uVar2 - 0x100;
      }
      iVar5 = vs_se((bitstream *)CONCAT44(uVar2,iVar1),
                    (int32_t *)CONCAT44(iVar5,in_stack_ffffffffffffffc0));
      if (iVar5 != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int h264_scaling_list(struct bitstream *str, uint32_t *scaling_list, int size, uint32_t *use_default_flag) {
	uint32_t lastScale = 8;
	uint32_t nextScale = 8;
	int32_t delta_scale;
	int i;
	if (str->dir == VS_DECODE) {
		for (i = 0; i < size; i++) {
			if (nextScale != 0) {
				if (vs_se(str, &delta_scale)) return 1;
				nextScale = (lastScale + delta_scale + 256)%256;
				*use_default_flag = (i == 0 && nextScale == 0);
			}
			lastScale = scaling_list[i] = (nextScale?nextScale:lastScale);
		}
	} else {
		int haltidx = size;
		if (*use_default_flag)
			haltidx = 0;
		while (haltidx >= 2 && scaling_list[haltidx-1] == scaling_list[haltidx-2])
			haltidx--;
		for (i = 0; i < haltidx; i++) {
			delta_scale = (scaling_list[i] - lastScale + 256)%256;
			if (delta_scale >= 128)
				delta_scale -= 256;
			if (vs_se(str, &delta_scale)) return 1;
			lastScale = scaling_list[i];
		}
		if (i != size) {
			delta_scale = (0 - lastScale + 256)%256;
			if (delta_scale >= 128)
				delta_scale -= 256;
			if (vs_se(str, &delta_scale)) return 1;
		}
	}
	return 0;
}